

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

bool __thiscall Js::JavascriptSet::DeleteFromVarSet<false>(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  MapOrSetDataNode<void_*> *local_28;
  SetDataNode *node;
  Var value_local;
  JavascriptSet *this_local;
  
  node = (SetDataNode *)value;
  value_local = this;
  if (this->kind != SimpleVarSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1ef,
                                "(this->kind == (isComplex ? SetKind::ComplexVarSet : SetKind::SimpleVarSet))"
                                ,
                                "this->kind == (isComplex ? SetKind::ComplexVarSet : SetKind::SimpleVarSet)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = (MapOrSetDataNode<void_*> *)0x0;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&(this->u).simpleVarSet);
  bVar2 = JsUtil::
          BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove(this_00,&node,&local_28);
  if (bVar2) {
    MapOrSetDataList<void_*>::Remove(&this->list,local_28);
  }
  return bVar2;
}

Assistant:

bool
JavascriptSet::DeleteFromVarSet(Var value)
{
    Assert(this->kind == (isComplex ? SetKind::ComplexVarSet : SetKind::SimpleVarSet));
    SetDataNode * node = nullptr;
    if (isComplex
        ? !this->u.complexVarSet->TryGetValueAndRemove(value, &node)
        : !this->u.simpleVarSet->TryGetValueAndRemove(value, &node))
    {
        return false;
    }

    this->list.Remove(node);
    return true;
}